

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int execute_op(int a,int b,char operator)

{
  uint uVar1;
  int iVar2;
  undefined7 in_register_00000011;
  double dVar3;
  
  iVar2 = (int)CONCAT71(in_register_00000011,operator);
  if (iVar2 < 0x3c) {
    switch(iVar2) {
    case 0x25:
      uVar1 = a % b;
      break;
    case 0x26:
      uVar1 = b & a;
      break;
    default:
      goto switchD_0010124f_caseD_27;
    case 0x2a:
      uVar1 = b * a;
      break;
    case 0x2b:
      uVar1 = b + a;
      break;
    case 0x2d:
      uVar1 = a - b;
      break;
    case 0x2f:
      uVar1 = a / b;
    }
  }
  else {
    if (iVar2 < 0x5e) {
      if (iVar2 == 0x3c) {
        return (uint)(a < b);
      }
      if (iVar2 == 0x3d) {
        return (uint)(a == b);
      }
      if (iVar2 == 0x3e) {
        return (uint)(b < a);
      }
    }
    else {
      if (iVar2 == 0x5e) {
        dVar3 = pow((double)a,(double)b);
        return (int)dVar3;
      }
      if (iVar2 == 0x7c) {
        return b | a;
      }
      if (iVar2 == 0x7e) {
        return b ^ a;
      }
    }
switchD_0010124f_caseD_27:
    uVar1 = 0;
    printf("Unknown operator: \'%c\'\n",(ulong)(uint)(int)operator);
  }
  return uVar1;
}

Assistant:

int execute_op(const int a, const int b, const char operator) {
  switch (operator) {
    case '+': return a + b;
    case '-': return a - b;
    case '*': return a * b;
    case '/': return a / b;
    case '%': return a % b;
    case '<': return a < b;
    case '>': return a > b;
    case '=': return a == b;
    case '^': return (int)(pow((double)a, (double)b));
    case '|': return a | b;
    case '&': return a & b;
    case '~': return a ^ b;
    default:
      printf("Unknown operator: '%c'\n", operator);
      return 0;
  }
}